

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
          (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
           *this,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,PackageSymbol **args_2)

{
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  *in_RSI;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>
  *in_RDI;
  PackageSymbol **in_R9;
  locator *it;
  arrays_type new_arrays_;
  arrays_type *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  try_emplace_args_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>
  *in_stack_ffffffffffffffb0;
  arrays_type *in_stack_ffffffffffffffb8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  *in_stack_ffffffffffffffc0;
  arrays_type *in_stack_ffffffffffffffc8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  *in_stack_ffffffffffffffd0;
  
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::new_arrays_for_growth(in_RSI);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>
  ::table_locator(in_RDI);
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::position_for(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,in_R9);
  in_RDI->pg = (group15<boost::unordered::detail::foa::plain_integral> *)in_stack_ffffffffffffffa0;
  *(size_t *)&in_RDI->n = in_stack_ffffffffffffffa8;
  in_RDI->p = in_stack_ffffffffffffffb0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::unchecked_rehash(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (in_RSI->size_ctrl).size = (in_RSI->size_ctrl).size + 1;
  return in_RDI;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }